

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::GatherGLSLCompile::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (**(code **)(*this + 0x48))(&local_38);
  std::operator+(&local_98,
                 "#version 310 es                            \nprecision highp float;                     \nout mediump vec4 color;                    \n"
                 ,&local_38);
  std::operator+(&local_78,&local_98,"  void main() {                            \n");
  (**(code **)(*this + 0x50))(&bStack_b8,this);
  std::operator+(&local_58,&local_78,&bStack_b8);
  std::operator+(__return_storage_ptr__,&local_58,
                 "    color = vec4(1);                       \n  }                                        \n"
                );
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                            \n"
			   "precision highp float;                     \n"
			   "out mediump vec4 color;                    \n" +
			   Uniforms() + "  void main() {                            \n" + Sampling() +
			   "    color = vec4(1);                       \n"
			   "  }                                        \n";
	}